

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O1

hash_t __thiscall duckdb::BoundLambdaRefExpression::Hash(BoundLambdaRefExpression *this)

{
  hash_t hVar1;
  hash_t hVar2;
  hash_t hVar3;
  hash_t hVar4;
  hash_t hVar5;
  
  hVar1 = Expression::Hash(&this->super_Expression);
  hVar2 = Hash<unsigned_long>(this->lambda_idx);
  hVar3 = Hash<unsigned_long>((this->binding).column_index);
  hVar4 = Hash<unsigned_long>((this->binding).table_index);
  hVar5 = Hash<unsigned_long>(this->depth);
  return hVar5 ^ hVar4 ^ hVar3 ^ hVar2 ^ hVar1;
}

Assistant:

hash_t BoundLambdaRefExpression::Hash() const {
	auto result = Expression::Hash();
	result = CombineHash(result, duckdb::Hash<uint64_t>(lambda_idx));
	result = CombineHash(result, duckdb::Hash<uint64_t>(binding.column_index));
	result = CombineHash(result, duckdb::Hash<uint64_t>(binding.table_index));
	return CombineHash(result, duckdb::Hash<uint64_t>(depth));
}